

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isUnion(Type *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  Type *in_RDI;
  Type *ct;
  bool local_1;
  
  pTVar2 = getCanonicalType(in_RDI);
  SVar1 = (pTVar2->super_Symbol).kind;
  local_1 = SVar1 == PackedUnionType || SVar1 == UnpackedUnionType;
  return local_1;
}

Assistant:

bool Type::isUnion() const {
    const Type& ct = getCanonicalType();
    switch (ct.kind) {
        case SymbolKind::UnpackedUnionType:
        case SymbolKind::PackedUnionType:
            return true;
        default:
            return false;
    }
}